

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_exp.h
# Opt level: O2

void __thiscall
trento::FastExp<double>::FastExp(FastExp<double> *this,double xmin,double xmax,size_t nsteps)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t i;
  size_t sVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 in_XMM2 [16];
  allocator_type local_19;
  
  this->xmin_ = xmin;
  this->xmax_ = xmax;
  auVar1 = vcvtusi2sd_avx512f(in_XMM2,nsteps - 1);
  this->dx_ = (xmax - xmin) / auVar1._0_8_;
  std::vector<double,_std::allocator<double>_>::vector(&this->table_,nsteps,&local_19);
  for (sVar3 = 0; nsteps != sVar3; sVar3 = sVar3 + 1) {
    auVar2 = vcvtusi2sd_avx512f(in_XMM2,sVar3);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = this->dx_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->xmin_;
    auVar1 = vfmadd213sd_fma(auVar5,auVar2,auVar1);
    dVar4 = exp(auVar1._0_8_);
    (this->table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[sVar3] = dVar4;
  }
  return;
}

Assistant:

FastExp<T>::FastExp(T xmin, T xmax, std::size_t nsteps)
    : xmin_(xmin),
      xmax_(xmax),
      dx_((xmax-xmin)/(nsteps-1)),
      table_(nsteps) {
  // Tabulate evenly-spaced exp() values.
  for (std::size_t i = 0; i < nsteps; ++i)
    table_[i] = std::exp(xmin_ + i*dx_);
}